

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,ASTRoot *node)

{
  pointer psVar1;
  element_type *peVar2;
  VarDecl *node_00;
  long lVar3;
  shared_ptr<mocker::ast::Declaration> *decl;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<mocker::ast::Declaration> *decl_1;
  bool bVar6;
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  globalVars;
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (node->decls).
           super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (node->decls).
                super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar2 == (element_type *)0x0) {
      node_00 = (VarDecl *)0x0;
    }
    else {
      node_00 = (VarDecl *)
                __dynamic_cast(peVar2,&ast::Declaration::typeinfo,&ast::VarDecl::typeinfo,0);
    }
    if (node_00 == (VarDecl *)0x0) {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      node_00 = (VarDecl *)0x0;
    }
    else {
      p_Var5 = (psVar4->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
    }
    if (node_00 != (VarDecl *)0x0) {
      renameGlobalVar(this,node_00);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
  }
  psVar1 = (node->decls).
           super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (node->decls).
                super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar2 == (element_type *)0x0) {
      bVar6 = true;
    }
    else {
      lVar3 = __dynamic_cast(peVar2,&ast::Declaration::typeinfo,&ast::VarDecl::typeinfo,0);
      bVar6 = lVar3 == 0;
    }
    if (bVar6) {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var5 = (psVar4->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if (bVar6) {
      peVar2 = (psVar4->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var5 = (psVar4->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      (*(peVar2->super_ASTNode)._vptr_ASTNode[2])(peVar2,this);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
    }
  }
  std::
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void operator()(ast::ASTRoot &node) const override {
    std::vector<std::shared_ptr<ast::VarDecl>> globalVars;
    for (auto &decl : node.decls)
      if (auto p = std::dynamic_pointer_cast<ast::VarDecl>(decl))
        renameGlobalVar(*p);

    for (auto &decl : node.decls) {
      if (std::dynamic_pointer_cast<ast::VarDecl>(decl))
        continue;
      visit(decl);
    }
  }